

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,Array<char> *chars)

{
  RemoveConst<kj::Array<char>_> **ppRVar1;
  Array<char> *pAVar2;
  Array<char> *pAVar3;
  RemoveConst<kj::Array<char>_> *pRVar4;
  size_t newSize;
  
  pAVar2 = (this->ownedStrings).builder.endPtr;
  if ((this->ownedStrings).builder.pos == pAVar2) {
    pAVar3 = (this->ownedStrings).builder.ptr;
    newSize = 4;
    if (pAVar2 != pAVar3) {
      newSize = ((long)pAVar2 - (long)pAVar3 >> 3) * 0x5555555555555556;
    }
    Vector<kj::Array<char>_>::setCapacity(&this->ownedStrings,newSize);
  }
  pRVar4 = (this->ownedStrings).builder.pos;
  pRVar4->ptr = chars->ptr;
  pRVar4->size_ = chars->size_;
  pRVar4->disposer = chars->disposer;
  chars->ptr = (char *)0x0;
  chars->size_ = 0;
  ppRVar1 = &(this->ownedStrings).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

void HttpHeaders::takeOwnership(kj::Array<char>&& chars) {
  ownedStrings.add(kj::mv(chars));
}